

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O0

Stats * __thiscall Arena::stats(Arena *this)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  pointer ppVar6;
  _Node_iterator_base<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false>
  *in_RSI;
  Stats *in_RDI;
  long in_FS_OFFSET;
  Stats *r;
  value_type *chunk_1;
  ChunkToSizeMap *__range1_1;
  value_type *chunk;
  unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  *__range1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  Stats *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->used = 0;
  in_RDI->free = 0;
  in_RDI->total = 0;
  this_00 = in_RDI;
  sVar3 = std::
          unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
          ::size((unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                  *)in_RDI);
  this_00->chunks_used = sVar3;
  sVar4 = std::
          unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
          ::size((unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
                  *)in_RDI);
  this_00->chunks_free = sVar4;
  std::
  unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::begin((unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
           *)this_00);
  std::
  unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::end((unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
         *)this_00);
  while( true ) {
    bVar2 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false> *)in_RSI,
                       (_Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false> *)this_00)
    ;
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pvVar5 = std::__detail::
             _Node_const_iterator<std::pair<void_*const,_unsigned_long>,_false,_false>::operator*
                       ((_Node_const_iterator<std::pair<void_*const,_unsigned_long>,_false,_false> *
                        )in_RDI);
    this_00->used = pvVar5->second + this_00->used;
    std::__detail::_Node_const_iterator<std::pair<void_*const,_unsigned_long>,_false,_false>::
    operator++((_Node_const_iterator<std::pair<void_*const,_unsigned_long>,_false,_false> *)in_RDI);
  }
  std::
  unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
  ::begin((unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
           *)this_00);
  std::
  unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
  ::end((unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
         *)this_00);
  while( true ) {
    bVar2 = std::__detail::operator==
                      (in_RSI,(_Node_iterator_base<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false>
                               *)this_00);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::__detail::
    _Node_const_iterator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false,_false>
    ::operator*((_Node_const_iterator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false,_false>
                 *)in_RDI);
    ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_> *)in_RDI);
    this_00->free = ppVar6->first + this_00->free;
    std::__detail::
    _Node_const_iterator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false,_false>
    ::operator++((_Node_const_iterator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false,_false>
                  *)in_RDI);
  }
  this_00->total = this_00->used + this_00->free;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Arena::Stats Arena::stats() const
{
    Arena::Stats r{ 0, 0, 0, chunks_used.size(), chunks_free.size() };
    for (const auto& chunk: chunks_used)
        r.used += chunk.second;
    for (const auto& chunk: chunks_free)
        r.free += chunk.second->first;
    r.total = r.used + r.free;
    return r;
}